

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void am_do_generalize_script_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object script_window;
  Am_Value_List sel_list;
  Am_Object scroll_menu;
  
  Am_Object::Get_Object((Am_Object *)&sel_list,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&script_window,(Am_Slot_Flags)&sel_list);
  Am_Object::~Am_Object((Am_Object *)&sel_list);
  pAVar2 = Am_Object::Get(&script_window,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object(&scroll_menu,pAVar2);
  pAVar2 = Am_Object::Get(&scroll_menu,0x171,3);
  Am_Value_List::Am_Value_List(&sel_list,pAVar2);
  bVar1 = Am_Value_List::Valid(&sel_list);
  if (bVar1) {
    Am_Pop_Up_Generalize_DB(&script_window,&sel_list);
  }
  Am_Value_List::~Am_Value_List(&sel_list);
  Am_Object::~Am_Object(&scroll_menu);
  Am_Object::~Am_Object(&script_window);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_do_generalize_script,
                 (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list =
      scroll_menu.Get(Am_SAVED_OLD_OBJECT_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (sel_list.Valid())
    Am_Pop_Up_Generalize_DB(script_window, sel_list);
}